

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

string * __thiscall
slang::SVInt::toString_abi_cxx11_
          (string *__return_storage_ptr__,SVInt *this,LiteralBase base,
          bitwidth_t abbreviateThresholdBits)

{
  bool includeBase;
  undefined7 in_register_00000011;
  EVP_PKEY_CTX *ctx;
  SmallVector<char,_40UL> buffer;
  SmallVectorBase<char> local_48 [2];
  
  includeBase = true;
  if ((((int)CONCAT71(in_register_00000011,base) == 2) &&
      ((this->super_SVIntStorage).bitWidth == 0x20)) &&
     ((this->super_SVIntStorage).signFlag == true)) {
    includeBase = (this->super_SVIntStorage).unknownFlag;
  }
  local_48[0].data_ = local_48[0].firstElement;
  local_48[0].len = 0;
  local_48[0].cap = 0x28;
  writeTo(this,local_48,base,includeBase,abbreviateThresholdBits);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ctx = (EVP_PKEY_CTX *)local_48[0].data_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_48[0].data_,
             (EVP_PKEY_CTX *)(local_48[0].data_ + local_48[0].len));
  SmallVectorBase<char>::cleanup(local_48,ctx);
  return __return_storage_ptr__;
}

Assistant:

std::string SVInt::toString(LiteralBase base, bitwidth_t abbreviateThresholdBits) const {
    // Append the base unless we're a signed 32-bit base 10 integer.
    bool includeBase = base != LiteralBase::Decimal || bitWidth != 32 || !signFlag || unknownFlag;

    SmallVector<char> buffer;
    writeTo(buffer, base, includeBase, abbreviateThresholdBits);
    return std::string(buffer.begin(), buffer.end());
}